

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O0

long kj::TlsConnection::bioCtrl(BIO *b,int cmd,long num,void *ptr)

{
  bool bVar1;
  long lVar2;
  bool local_31;
  bool _kj_shouldLog;
  void *ptr_local;
  long num_local;
  BIO *pBStack_18;
  int cmd_local;
  BIO *b_local;
  
  num_local._4_4_ = cmd;
  pBStack_18 = b;
  if (cmd == 2) {
    lVar2 = BIO_get_data(b);
    bVar1 = ReadyInputStreamWrapper::isAtEnd((ReadyInputStreamWrapper *)(lVar2 + 0x40));
    b_local = (BIO *)(ulong)bVar1;
  }
  else if (cmd - 6U < 2) {
    b_local = (BIO *)0x0;
  }
  else if (cmd == 0xb) {
    b_local = (BIO *)0x1;
  }
  else if ((cmd == 0x49) || (cmd == 0x4c)) {
    b_local = (BIO *)0x0;
  }
  else {
    local_31 = kj::_::Debug::shouldLog(WARNING);
    while (local_31 != false) {
      kj::_::Debug::log<char_const(&)[23],int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++"
                 ,0x1d4,WARNING,"\"unimplemented bio_ctrl\", cmd",
                 (char (*) [23])"unimplemented bio_ctrl",(int *)((long)&num_local + 4));
      local_31 = false;
    }
    b_local = (BIO *)0x0;
  }
  return (long)b_local;
}

Assistant:

static long bioCtrl(BIO* b, int cmd, long num, void* ptr) {
    switch (cmd) {
      case BIO_CTRL_EOF:
        return reinterpret_cast<TlsConnection*>(BIO_get_data(b))->readBuffer.isAtEnd();
      case BIO_CTRL_FLUSH:
        return 1;
      case BIO_CTRL_PUSH:
      case BIO_CTRL_POP:
        // Informational?
        return 0;
#ifdef BIO_CTRL_GET_KTLS_SEND
      case BIO_CTRL_GET_KTLS_SEND:
      case BIO_CTRL_GET_KTLS_RECV:
        // TODO(someday): Support kTLS if the underlying stream is a raw socket.
        return 0;
#endif
      default:
        KJ_LOG(WARNING, "unimplemented bio_ctrl", cmd);
        return 0;
    }
  }